

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCRayQueryContext *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  int iVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [16];
  int *piVar47;
  ulong uVar48;
  undefined1 (*pauVar49) [16];
  ulong uVar50;
  Scene *pSVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  undefined1 (*pauVar54) [16];
  undefined4 uVar55;
  ulong unaff_R12;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar70;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar67 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar95;
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  float fVar102;
  undefined1 auVar103 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [64];
  uint uVar108;
  uint uVar110;
  uint uVar111;
  uint uVar112;
  undefined1 auVar109 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  float fVar116;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2674;
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  RTCIntersectArguments *local_2618;
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [16];
  Geometry *local_25d0;
  int *local_25c8;
  ulong local_25c0;
  ulong local_25b8;
  float local_25b0;
  undefined4 local_25ac;
  undefined4 local_25a8;
  float local_25a4;
  float local_25a0;
  undefined4 local_259c;
  uint local_2598;
  uint local_2594;
  uint local_2590;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2510 [16];
  float local_2500 [4];
  float local_24f0 [4];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar71 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar92._8_4_ = 0x7fffffff;
      auVar92._0_8_ = 0x7fffffff7fffffff;
      auVar92._12_4_ = 0x7fffffff;
      auVar92 = vandps_avx((undefined1  [16])aVar2,auVar92);
      auVar96._8_4_ = 0x219392ef;
      auVar96._0_8_ = 0x219392ef219392ef;
      auVar96._12_4_ = 0x219392ef;
      auVar92 = vcmpps_avx(auVar92,auVar96,1);
      auVar92 = vblendvps_avx((undefined1  [16])aVar2,auVar96,auVar92);
      pauVar54 = (undefined1 (*) [16])local_2390;
      auVar96 = vrcpps_avx(auVar92);
      fVar60 = auVar96._0_4_;
      auVar88._0_4_ = auVar92._0_4_ * fVar60;
      fVar68 = auVar96._4_4_;
      auVar88._4_4_ = auVar92._4_4_ * fVar68;
      fVar69 = auVar96._8_4_;
      auVar88._8_4_ = auVar92._8_4_ * fVar69;
      fVar70 = auVar96._12_4_;
      auVar88._12_4_ = auVar92._12_4_ * fVar70;
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = &DAT_3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar92 = vsubps_avx(auVar97,auVar88);
      uVar55 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar55;
      local_23c0._0_4_ = uVar55;
      local_23c0._8_4_ = uVar55;
      local_23c0._12_4_ = uVar55;
      local_23c0._16_4_ = uVar55;
      local_23c0._20_4_ = uVar55;
      local_23c0._24_4_ = uVar55;
      local_23c0._28_4_ = uVar55;
      auVar99 = ZEXT3264(local_23c0);
      uVar55 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar55;
      local_23e0._0_4_ = uVar55;
      local_23e0._8_4_ = uVar55;
      local_23e0._12_4_ = uVar55;
      local_23e0._16_4_ = uVar55;
      local_23e0._20_4_ = uVar55;
      local_23e0._24_4_ = uVar55;
      local_23e0._28_4_ = uVar55;
      auVar101 = ZEXT3264(local_23e0);
      uVar55 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar55;
      local_2400._0_4_ = uVar55;
      local_2400._8_4_ = uVar55;
      local_2400._12_4_ = uVar55;
      local_2400._16_4_ = uVar55;
      local_2400._20_4_ = uVar55;
      local_2400._24_4_ = uVar55;
      local_2400._28_4_ = uVar55;
      auVar104 = ZEXT3264(local_2400);
      auVar89._0_4_ = fVar60 + fVar60 * auVar92._0_4_;
      auVar89._4_4_ = fVar68 + fVar68 * auVar92._4_4_;
      auVar89._8_4_ = fVar69 + fVar69 * auVar92._8_4_;
      auVar89._12_4_ = fVar70 + fVar70 * auVar92._12_4_;
      auVar92 = vshufps_avx(auVar89,auVar89,0);
      local_2420._16_16_ = auVar92;
      local_2420._0_16_ = auVar92;
      auVar109 = ZEXT3264(local_2420);
      auVar92 = vmovshdup_avx(auVar89);
      auVar96 = vshufps_avx(auVar89,auVar89,0x55);
      local_2440._16_16_ = auVar96;
      local_2440._0_16_ = auVar96;
      auVar113 = ZEXT3264(local_2440);
      auVar96 = vshufpd_avx(auVar89,auVar89,1);
      auVar88 = vshufps_avx(auVar89,auVar89,0xaa);
      uVar52 = (ulong)(auVar89._0_4_ < 0.0) << 5;
      local_2460._16_16_ = auVar88;
      local_2460._0_16_ = auVar88;
      auVar114 = ZEXT3264(local_2460);
      uVar58 = (ulong)(auVar92._0_4_ < 0.0) << 5 | 0x40;
      uVar45 = (ulong)(auVar96._0_4_ < 0.0) << 5 | 0x80;
      uVar48 = uVar52 ^ 0x20;
      local_25b8 = uVar45 ^ 0x20;
      auVar92 = vshufps_avx(auVar71,auVar71,0);
      local_2480._16_16_ = auVar92;
      local_2480._0_16_ = auVar92;
      auVar115 = ZEXT3264(local_2480);
      auVar92 = vshufps_avx(auVar82,auVar82,0);
      auVar67 = ZEXT3264(CONCAT1616(auVar92,auVar92));
      local_2580 = mm_lookupmask_ps._240_8_;
      uStack_2578 = mm_lookupmask_ps._248_8_;
      local_25c0 = uVar58;
      uVar59 = uVar58;
      do {
        do {
          do {
            if (pauVar54 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar53 = pauVar54 + -1;
            pauVar54 = pauVar54 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar53 + 8));
          uVar57 = *(ulong *)*pauVar54;
          do {
            auVar103 = auVar104._0_32_;
            auVar100 = auVar101._0_32_;
            auVar98 = auVar99._0_32_;
            if ((uVar57 & 8) == 0) {
              auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar57 + 0x40 + uVar52),auVar98);
              auVar34._4_4_ = auVar109._4_4_ * auVar33._4_4_;
              auVar34._0_4_ = auVar109._0_4_ * auVar33._0_4_;
              auVar34._8_4_ = auVar109._8_4_ * auVar33._8_4_;
              auVar34._12_4_ = auVar109._12_4_ * auVar33._12_4_;
              auVar34._16_4_ = auVar109._16_4_ * auVar33._16_4_;
              auVar34._20_4_ = auVar109._20_4_ * auVar33._20_4_;
              auVar34._24_4_ = auVar109._24_4_ * auVar33._24_4_;
              auVar34._28_4_ = auVar33._28_4_;
              auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar57 + 0x40 + uVar59),auVar100);
              auVar36._4_4_ = auVar113._4_4_ * auVar33._4_4_;
              auVar36._0_4_ = auVar113._0_4_ * auVar33._0_4_;
              auVar36._8_4_ = auVar113._8_4_ * auVar33._8_4_;
              auVar36._12_4_ = auVar113._12_4_ * auVar33._12_4_;
              auVar36._16_4_ = auVar113._16_4_ * auVar33._16_4_;
              auVar36._20_4_ = auVar113._20_4_ * auVar33._20_4_;
              auVar36._24_4_ = auVar113._24_4_ * auVar33._24_4_;
              auVar36._28_4_ = auVar33._28_4_;
              auVar33 = vmaxps_avx(auVar34,auVar36);
              auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar57 + 0x40 + uVar45),auVar103);
              auVar37._4_4_ = auVar114._4_4_ * auVar34._4_4_;
              auVar37._0_4_ = auVar114._0_4_ * auVar34._0_4_;
              auVar37._8_4_ = auVar114._8_4_ * auVar34._8_4_;
              auVar37._12_4_ = auVar114._12_4_ * auVar34._12_4_;
              auVar37._16_4_ = auVar114._16_4_ * auVar34._16_4_;
              auVar37._20_4_ = auVar114._20_4_ * auVar34._20_4_;
              auVar37._24_4_ = auVar114._24_4_ * auVar34._24_4_;
              auVar37._28_4_ = auVar34._28_4_;
              auVar34 = vmaxps_avx(auVar37,auVar115._0_32_);
              local_2560 = vmaxps_avx(auVar33,auVar34);
              auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar57 + 0x40 + uVar48),auVar98);
              auVar38._4_4_ = auVar109._4_4_ * auVar33._4_4_;
              auVar38._0_4_ = auVar109._0_4_ * auVar33._0_4_;
              auVar38._8_4_ = auVar109._8_4_ * auVar33._8_4_;
              auVar38._12_4_ = auVar109._12_4_ * auVar33._12_4_;
              auVar38._16_4_ = auVar109._16_4_ * auVar33._16_4_;
              auVar38._20_4_ = auVar109._20_4_ * auVar33._20_4_;
              auVar38._24_4_ = auVar109._24_4_ * auVar33._24_4_;
              auVar38._28_4_ = auVar33._28_4_;
              auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar57 + 0x40 + (uVar58 ^ 0x20)),auVar100)
              ;
              auVar39._4_4_ = auVar113._4_4_ * auVar33._4_4_;
              auVar39._0_4_ = auVar113._0_4_ * auVar33._0_4_;
              auVar39._8_4_ = auVar113._8_4_ * auVar33._8_4_;
              auVar39._12_4_ = auVar113._12_4_ * auVar33._12_4_;
              auVar39._16_4_ = auVar113._16_4_ * auVar33._16_4_;
              auVar39._20_4_ = auVar113._20_4_ * auVar33._20_4_;
              auVar39._24_4_ = auVar113._24_4_ * auVar33._24_4_;
              auVar39._28_4_ = auVar33._28_4_;
              auVar33 = vminps_avx(auVar38,auVar39);
              auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar57 + 0x40 + local_25b8),auVar103);
              auVar40._4_4_ = auVar114._4_4_ * auVar34._4_4_;
              auVar40._0_4_ = auVar114._0_4_ * auVar34._0_4_;
              auVar40._8_4_ = auVar114._8_4_ * auVar34._8_4_;
              auVar40._12_4_ = auVar114._12_4_ * auVar34._12_4_;
              auVar40._16_4_ = auVar114._16_4_ * auVar34._16_4_;
              auVar40._20_4_ = auVar114._20_4_ * auVar34._20_4_;
              auVar40._24_4_ = auVar114._24_4_ * auVar34._24_4_;
              auVar40._28_4_ = auVar34._28_4_;
              auVar34 = vminps_avx(auVar40,auVar67._0_32_);
              auVar33 = vminps_avx(auVar33,auVar34);
              auVar33 = vcmpps_avx(local_2560,auVar33,2);
              uVar55 = vmovmskps_avx(auVar33);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar55);
            }
            if ((uVar57 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar42 = 4;
              }
              else {
                uVar56 = uVar57 & 0xfffffffffffffff0;
                lVar44 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                  }
                }
                iVar42 = 0;
                uVar57 = *(ulong *)(uVar56 + lVar44 * 8);
                uVar50 = unaff_R12 - 1 & unaff_R12;
                if (uVar50 != 0) {
                  uVar108 = *(uint *)(local_2560 + lVar44 * 4);
                  lVar44 = 0;
                  if (uVar50 != 0) {
                    for (; (uVar50 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                    }
                  }
                  uVar3 = *(ulong *)(uVar56 + lVar44 * 8);
                  uVar110 = *(uint *)(local_2560 + lVar44 * 4);
                  uVar50 = uVar50 - 1 & uVar50;
                  if (uVar50 == 0) {
                    if (uVar108 < uVar110) {
                      *(ulong *)*pauVar54 = uVar3;
                      *(uint *)(*pauVar54 + 8) = uVar110;
                      pauVar54 = pauVar54 + 1;
                    }
                    else {
                      *(ulong *)*pauVar54 = uVar57;
                      *(uint *)(*pauVar54 + 8) = uVar108;
                      pauVar54 = pauVar54 + 1;
                      uVar57 = uVar3;
                    }
                  }
                  else {
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar57;
                    auVar92 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar108));
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = uVar3;
                    auVar71 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar110));
                    lVar44 = 0;
                    if (uVar50 != 0) {
                      for (; (uVar50 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                      }
                    }
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = *(ulong *)(uVar56 + lVar44 * 8);
                    auVar82 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_2560 + lVar44 * 4)));
                    uVar50 = uVar50 - 1 & uVar50;
                    if (uVar50 == 0) {
                      auVar96 = vpcmpgtd_avx(auVar71,auVar92);
                      auVar88 = vpshufd_avx(auVar96,0xaa);
                      auVar96 = vblendvps_avx(auVar71,auVar92,auVar88);
                      auVar92 = vblendvps_avx(auVar92,auVar71,auVar88);
                      auVar71 = vpcmpgtd_avx(auVar82,auVar96);
                      auVar88 = vpshufd_avx(auVar71,0xaa);
                      auVar71 = vblendvps_avx(auVar82,auVar96,auVar88);
                      auVar82 = vblendvps_avx(auVar96,auVar82,auVar88);
                      auVar96 = vpcmpgtd_avx(auVar82,auVar92);
                      auVar88 = vpshufd_avx(auVar96,0xaa);
                      auVar96 = vblendvps_avx(auVar82,auVar92,auVar88);
                      auVar92 = vblendvps_avx(auVar92,auVar82,auVar88);
                      *pauVar54 = auVar92;
                      pauVar54[1] = auVar96;
                      uVar57 = auVar71._0_8_;
                      pauVar54 = pauVar54 + 2;
                    }
                    else {
                      lVar44 = 0;
                      if (uVar50 != 0) {
                        for (; (uVar50 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                        }
                      }
                      auVar93._8_8_ = 0;
                      auVar93._0_8_ = *(ulong *)(uVar56 + lVar44 * 8);
                      auVar96 = vpunpcklqdq_avx(auVar93,ZEXT416(*(uint *)(local_2560 + lVar44 * 4)))
                      ;
                      uVar50 = uVar50 - 1 & uVar50;
                      if (uVar50 == 0) {
                        auVar88 = vpcmpgtd_avx(auVar71,auVar92);
                        auVar89 = vpshufd_avx(auVar88,0xaa);
                        auVar88 = vblendvps_avx(auVar71,auVar92,auVar89);
                        auVar92 = vblendvps_avx(auVar92,auVar71,auVar89);
                        auVar71 = vpcmpgtd_avx(auVar96,auVar82);
                        auVar89 = vpshufd_avx(auVar71,0xaa);
                        auVar71 = vblendvps_avx(auVar96,auVar82,auVar89);
                        auVar82 = vblendvps_avx(auVar82,auVar96,auVar89);
                        auVar96 = vpcmpgtd_avx(auVar82,auVar92);
                        auVar89 = vpshufd_avx(auVar96,0xaa);
                        auVar96 = vblendvps_avx(auVar82,auVar92,auVar89);
                        auVar92 = vblendvps_avx(auVar92,auVar82,auVar89);
                        auVar82 = vpcmpgtd_avx(auVar71,auVar88);
                        auVar89 = vpshufd_avx(auVar82,0xaa);
                        auVar82 = vblendvps_avx(auVar71,auVar88,auVar89);
                        auVar71 = vblendvps_avx(auVar88,auVar71,auVar89);
                        auVar88 = vpcmpgtd_avx(auVar96,auVar71);
                        auVar89 = vpshufd_avx(auVar88,0xaa);
                        auVar88 = vblendvps_avx(auVar96,auVar71,auVar89);
                        auVar71 = vblendvps_avx(auVar71,auVar96,auVar89);
                        *pauVar54 = auVar92;
                        pauVar54[1] = auVar71;
                        pauVar54[2] = auVar88;
                        uVar57 = auVar82._0_8_;
                        pauVar53 = pauVar54 + 3;
                      }
                      else {
                        *pauVar54 = auVar92;
                        pauVar54[1] = auVar71;
                        pauVar54[2] = auVar82;
                        pauVar54[3] = auVar96;
                        lVar44 = 0x30;
                        do {
                          lVar43 = lVar44;
                          lVar44 = 0;
                          if (uVar50 != 0) {
                            for (; (uVar50 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                            }
                          }
                          auVar72._8_8_ = 0;
                          auVar72._0_8_ = *(ulong *)(uVar56 + lVar44 * 8);
                          auVar92 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_2560 +
                                                                             lVar44 * 4)));
                          *(undefined1 (*) [16])(pauVar54[1] + lVar43) = auVar92;
                          uVar50 = uVar50 & uVar50 - 1;
                          lVar44 = lVar43 + 0x10;
                        } while (uVar50 != 0);
                        pauVar53 = (undefined1 (*) [16])(pauVar54[1] + lVar43);
                        if (lVar43 + 0x10 != 0) {
                          lVar44 = 0x10;
                          pauVar46 = pauVar54;
                          do {
                            auVar92 = pauVar46[1];
                            uVar108 = *(uint *)(pauVar46[1] + 8);
                            pauVar46 = pauVar46 + 1;
                            lVar43 = lVar44;
                            do {
                              if (uVar108 <= *(uint *)(pauVar54[-1] + lVar43 + 8)) {
                                pauVar49 = (undefined1 (*) [16])(*pauVar54 + lVar43);
                                break;
                              }
                              *(undefined1 (*) [16])(*pauVar54 + lVar43) =
                                   *(undefined1 (*) [16])(pauVar54[-1] + lVar43);
                              lVar43 = lVar43 + -0x10;
                              pauVar49 = pauVar54;
                            } while (lVar43 != 0);
                            *pauVar49 = auVar92;
                            lVar44 = lVar44 + 0x10;
                          } while (pauVar53 != pauVar46);
                        }
                        uVar57 = *(ulong *)*pauVar53;
                      }
                      auVar99 = ZEXT3264(auVar98);
                      auVar101 = ZEXT3264(auVar100);
                      auVar104 = ZEXT3264(auVar103);
                      auVar109 = ZEXT3264(auVar109._0_32_);
                      auVar113 = ZEXT3264(auVar113._0_32_);
                      auVar114 = ZEXT3264(auVar114._0_32_);
                      auVar115 = ZEXT3264(auVar115._0_32_);
                      pauVar54 = pauVar53;
                      iVar42 = 0;
                    }
                  }
                }
              }
            }
            else {
              iVar42 = 6;
            }
          } while (iVar42 == 0);
        } while (iVar42 != 6);
        uVar59 = (ulong)((uint)uVar57 & 0xf);
        if (uVar59 != 8) {
          uVar57 = uVar57 & 0xfffffffffffffff0;
          pSVar51 = context->scene;
          lVar44 = 0;
          do {
            lVar43 = lVar44 * 0x50;
            ppfVar4 = (pSVar51->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar57 + 0x30 + lVar43)];
            pfVar6 = ppfVar4[*(uint *)(uVar57 + 0x34 + lVar43)];
            pfVar7 = ppfVar4[*(uint *)(uVar57 + 0x38 + lVar43)];
            pfVar8 = ppfVar4[*(uint *)(uVar57 + 0x3c + lVar43)];
            auVar82 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar57 + lVar43)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar57 + 8 + lVar43)))
            ;
            auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar57 + lVar43)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar57 + 8 + lVar43)))
            ;
            auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar57 + 4 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar57 + 0xc + lVar43)));
            auVar71 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar57 + 4 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar57 + 0xc + lVar43)));
            auVar89 = vunpcklps_avx(auVar92,auVar71);
            auVar97 = vunpcklps_avx(auVar82,auVar96);
            auVar88 = vunpckhps_avx(auVar82,auVar96);
            auVar82 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar57 + 0x10 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar57 + 0x18 + lVar43)));
            auVar92 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar57 + 0x10 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar57 + 0x18 + lVar43)));
            auVar96 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar57 + 0x14 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar57 + 0x1c + lVar43)));
            auVar71 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar57 + 0x14 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar57 + 0x1c + lVar43)));
            auVar90 = vunpcklps_avx(auVar92,auVar71);
            auVar93 = vunpcklps_avx(auVar82,auVar96);
            auVar92 = vunpckhps_avx(auVar82,auVar96);
            auVar96 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar57 + 0x20 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar57 + 0x28 + lVar43)));
            auVar71 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar57 + 0x20 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar57 + 0x28 + lVar43)));
            auVar72 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar57 + 0x24 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar57 + 0x2c + lVar43)));
            auVar82 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar57 + 0x24 + lVar43)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar57 + 0x2c + lVar43)));
            auVar35 = vunpcklps_avx(auVar71,auVar82);
            auVar71 = vunpcklps_avx(auVar96,auVar72);
            auVar82 = vunpckhps_avx(auVar96,auVar72);
            puVar1 = (undefined8 *)(uVar57 + 0x30 + lVar43);
            local_2490 = *puVar1;
            uStack_2488 = puVar1[1];
            puVar1 = (undefined8 *)(uVar57 + 0x40 + lVar43);
            local_2570 = *puVar1;
            uStack_2568 = puVar1[1];
            local_2640 = vsubps_avx(auVar97,auVar93);
            local_2650 = vsubps_avx(auVar88,auVar92);
            auVar92 = vsubps_avx(auVar89,auVar90);
            auVar71 = vsubps_avx(auVar71,auVar97);
            auVar82 = vsubps_avx(auVar82,auVar88);
            auVar96 = vsubps_avx(auVar35,auVar89);
            fVar70 = auVar96._0_4_;
            fVar122 = local_2650._0_4_;
            auVar61._0_4_ = fVar122 * fVar70;
            fVar15 = auVar96._4_4_;
            fVar125 = local_2650._4_4_;
            auVar61._4_4_ = fVar125 * fVar15;
            fVar21 = auVar96._8_4_;
            fVar126 = local_2650._8_4_;
            auVar61._8_4_ = fVar126 * fVar21;
            fVar27 = auVar96._12_4_;
            fVar127 = local_2650._12_4_;
            auVar61._12_4_ = fVar127 * fVar27;
            fVar95 = auVar82._0_4_;
            fVar102 = auVar92._0_4_;
            auVar73._0_4_ = fVar102 * fVar95;
            fVar16 = auVar82._4_4_;
            fVar105 = auVar92._4_4_;
            auVar73._4_4_ = fVar105 * fVar16;
            fVar22 = auVar82._8_4_;
            fVar106 = auVar92._8_4_;
            auVar73._8_4_ = fVar106 * fVar22;
            fVar28 = auVar82._12_4_;
            fVar107 = auVar92._12_4_;
            auVar73._12_4_ = fVar107 * fVar28;
            local_24d0 = vsubps_avx(auVar73,auVar61);
            fVar11 = auVar71._0_4_;
            auVar74._0_4_ = fVar102 * fVar11;
            fVar17 = auVar71._4_4_;
            auVar74._4_4_ = fVar105 * fVar17;
            fVar23 = auVar71._8_4_;
            auVar74._8_4_ = fVar106 * fVar23;
            fVar29 = auVar71._12_4_;
            auVar74._12_4_ = fVar107 * fVar29;
            fVar116 = local_2640._0_4_;
            auVar83._0_4_ = fVar116 * fVar70;
            fVar119 = local_2640._4_4_;
            auVar83._4_4_ = fVar119 * fVar15;
            fVar120 = local_2640._8_4_;
            auVar83._8_4_ = fVar120 * fVar21;
            fVar121 = local_2640._12_4_;
            auVar83._12_4_ = fVar121 * fVar27;
            local_24c0 = vsubps_avx(auVar83,auVar74);
            auVar84._0_4_ = fVar116 * fVar95;
            auVar84._4_4_ = fVar119 * fVar16;
            auVar84._8_4_ = fVar120 * fVar22;
            auVar84._12_4_ = fVar121 * fVar28;
            auVar91._0_4_ = fVar122 * fVar11;
            auVar91._4_4_ = fVar125 * fVar17;
            auVar91._8_4_ = fVar126 * fVar23;
            auVar91._12_4_ = fVar127 * fVar29;
            local_2670 = vsubps_avx(auVar91,auVar84);
            uVar55 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar62._4_4_ = uVar55;
            auVar62._0_4_ = uVar55;
            auVar62._8_4_ = uVar55;
            auVar62._12_4_ = uVar55;
            uVar55 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar117._4_4_ = uVar55;
            auVar117._0_4_ = uVar55;
            auVar117._8_4_ = uVar55;
            auVar117._12_4_ = uVar55;
            uVar55 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar123._4_4_ = uVar55;
            auVar123._0_4_ = uVar55;
            auVar123._8_4_ = uVar55;
            auVar123._12_4_ = uVar55;
            fVar60 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_2660 = vsubps_avx(auVar97,auVar62);
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar92 = vsubps_avx(auVar88,auVar117);
            auVar71 = vsubps_avx(auVar89,auVar123);
            fVar12 = auVar71._0_4_;
            auVar118._0_4_ = fVar60 * fVar12;
            fVar18 = auVar71._4_4_;
            auVar118._4_4_ = fVar60 * fVar18;
            fVar24 = auVar71._8_4_;
            auVar118._8_4_ = fVar60 * fVar24;
            fVar30 = auVar71._12_4_;
            auVar118._12_4_ = fVar60 * fVar30;
            fVar13 = auVar92._0_4_;
            auVar124._0_4_ = fVar68 * fVar13;
            fVar19 = auVar92._4_4_;
            auVar124._4_4_ = fVar68 * fVar19;
            fVar25 = auVar92._8_4_;
            auVar124._8_4_ = fVar68 * fVar25;
            fVar31 = auVar92._12_4_;
            auVar124._12_4_ = fVar68 * fVar31;
            auVar71 = vsubps_avx(auVar124,auVar118);
            fVar69 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar14 = local_2660._0_4_;
            auVar63._0_4_ = fVar68 * fVar14;
            fVar20 = local_2660._4_4_;
            auVar63._4_4_ = fVar68 * fVar20;
            fVar26 = local_2660._8_4_;
            auVar63._8_4_ = fVar68 * fVar26;
            fVar32 = local_2660._12_4_;
            auVar63._12_4_ = fVar68 * fVar32;
            auVar75._0_4_ = fVar69 * fVar12;
            auVar75._4_4_ = fVar69 * fVar18;
            auVar75._8_4_ = fVar69 * fVar24;
            auVar75._12_4_ = fVar69 * fVar30;
            auVar82 = vsubps_avx(auVar75,auVar63);
            auVar76._0_4_ = fVar69 * fVar13;
            auVar76._4_4_ = fVar69 * fVar19;
            auVar76._8_4_ = fVar69 * fVar25;
            auVar76._12_4_ = fVar69 * fVar31;
            auVar85._0_4_ = fVar60 * fVar14;
            auVar85._4_4_ = fVar60 * fVar20;
            auVar85._8_4_ = fVar60 * fVar26;
            auVar85._12_4_ = fVar60 * fVar32;
            auVar96 = vsubps_avx(auVar85,auVar76);
            auVar88 = local_2670;
            auVar86._0_4_ =
                 fVar69 * local_24d0._0_4_ + fVar60 * local_24c0._0_4_ + fVar68 * local_2670._0_4_;
            auVar86._4_4_ =
                 fVar69 * local_24d0._4_4_ + fVar60 * local_24c0._4_4_ + fVar68 * local_2670._4_4_;
            auVar86._8_4_ =
                 fVar69 * local_24d0._8_4_ + fVar60 * local_24c0._8_4_ + fVar68 * local_2670._8_4_;
            auVar86._12_4_ =
                 fVar69 * local_24d0._12_4_ +
                 fVar60 * local_24c0._12_4_ + fVar68 * local_2670._12_4_;
            auVar77._8_8_ = 0x8000000080000000;
            auVar77._0_8_ = 0x8000000080000000;
            auVar92 = vandps_avx(auVar86,auVar77);
            uVar108 = auVar92._0_4_;
            local_2560._0_4_ =
                 (float)(uVar108 ^
                        (uint)(fVar11 * auVar71._0_4_ +
                              fVar95 * auVar82._0_4_ + fVar70 * auVar96._0_4_));
            uVar110 = auVar92._4_4_;
            local_2560._4_4_ =
                 (float)(uVar110 ^
                        (uint)(fVar17 * auVar71._4_4_ +
                              fVar16 * auVar82._4_4_ + fVar15 * auVar96._4_4_));
            uVar111 = auVar92._8_4_;
            local_2560._8_4_ =
                 (float)(uVar111 ^
                        (uint)(fVar23 * auVar71._8_4_ +
                              fVar22 * auVar82._8_4_ + fVar21 * auVar96._8_4_));
            uVar112 = auVar92._12_4_;
            local_2560._12_4_ =
                 (float)(uVar112 ^
                        (uint)(fVar29 * auVar71._12_4_ +
                              fVar28 * auVar82._12_4_ + fVar27 * auVar96._12_4_));
            local_2560._16_4_ =
                 (float)(uVar108 ^
                        (uint)(auVar71._0_4_ * fVar116 +
                              auVar82._0_4_ * fVar122 + fVar102 * auVar96._0_4_));
            local_2560._20_4_ =
                 (float)(uVar110 ^
                        (uint)(auVar71._4_4_ * fVar119 +
                              auVar82._4_4_ * fVar125 + fVar105 * auVar96._4_4_));
            local_2560._24_4_ =
                 (float)(uVar111 ^
                        (uint)(auVar71._8_4_ * fVar120 +
                              auVar82._8_4_ * fVar126 + fVar106 * auVar96._8_4_));
            local_2560._28_4_ =
                 (float)(uVar112 ^
                        (uint)(auVar71._12_4_ * fVar121 +
                              auVar82._12_4_ * fVar127 + fVar107 * auVar96._12_4_));
            auVar82 = ZEXT416(0) << 0x20;
            auVar92 = vcmpps_avx(local_2560._0_16_,auVar82,5);
            auVar71 = vcmpps_avx(local_2560._16_16_,auVar82,5);
            auVar92 = vandps_avx(auVar92,auVar71);
            auVar78._8_4_ = 0x7fffffff;
            auVar78._0_8_ = 0x7fffffff7fffffff;
            auVar78._12_4_ = 0x7fffffff;
            local_2530 = vandps_avx(auVar86,auVar78);
            auVar71 = vcmpps_avx(auVar82,auVar86,4);
            auVar92 = vandps_avx(auVar92,auVar71);
            auVar79._0_4_ = local_2560._16_4_ + local_2560._0_4_;
            auVar79._4_4_ = local_2560._20_4_ + local_2560._4_4_;
            auVar79._8_4_ = local_2560._24_4_ + local_2560._8_4_;
            auVar79._12_4_ = local_2560._28_4_ + local_2560._12_4_;
            auVar71 = vcmpps_avx(auVar79,local_2530,2);
            auVar92 = vandps_avx(auVar92,auVar71);
            auVar35._8_8_ = uStack_2578;
            auVar35._0_8_ = local_2580;
            auVar35 = auVar35 & auVar92;
            if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar35[0xf] < '\0') {
              auVar41._8_8_ = uStack_2578;
              auVar41._0_8_ = local_2580;
              auVar92 = vandps_avx(auVar92,auVar41);
              local_2540._0_4_ =
                   (float)(uVar108 ^
                          (uint)(local_24d0._0_4_ * fVar14 +
                                local_24c0._0_4_ * fVar13 + fVar12 * local_2670._0_4_));
              local_2540._4_4_ =
                   (float)(uVar110 ^
                          (uint)(local_24d0._4_4_ * fVar20 +
                                local_24c0._4_4_ * fVar19 + fVar18 * local_2670._4_4_));
              local_2540._8_4_ =
                   (float)(uVar111 ^
                          (uint)(local_24d0._8_4_ * fVar26 +
                                local_24c0._8_4_ * fVar25 + fVar24 * local_2670._8_4_));
              local_2540._12_4_ =
                   (float)(uVar112 ^
                          (uint)(local_24d0._12_4_ * fVar32 +
                                local_24c0._12_4_ * fVar31 + fVar30 * local_2670._12_4_));
              fVar60 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar68 = local_2530._0_4_;
              auVar64._0_4_ = fVar68 * fVar60;
              fVar69 = local_2530._4_4_;
              auVar64._4_4_ = fVar69 * fVar60;
              fVar70 = local_2530._8_4_;
              auVar64._8_4_ = fVar70 * fVar60;
              fVar95 = local_2530._12_4_;
              auVar64._12_4_ = fVar95 * fVar60;
              auVar71 = vcmpps_avx(auVar64,local_2540,1);
              fVar60 = (ray->super_RayK<1>).tfar;
              auVar80._0_4_ = fVar68 * fVar60;
              auVar80._4_4_ = fVar69 * fVar60;
              auVar80._8_4_ = fVar70 * fVar60;
              auVar80._12_4_ = fVar95 * fVar60;
              auVar82 = vcmpps_avx(local_2540,auVar80,2);
              auVar71 = vandps_avx(auVar82,auVar71);
              auVar82 = auVar92 & auVar71;
              if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar82[0xf] < '\0') {
                auVar92 = vandps_avx(auVar92,auVar71);
                local_2510 = auVar92;
                local_24b0 = local_2670._0_8_;
                uStack_24a8 = local_2670._8_8_;
                auVar71 = vrcpps_avx(local_2530);
                fVar60 = auVar71._0_4_;
                auVar81._0_4_ = fVar68 * fVar60;
                fVar68 = auVar71._4_4_;
                auVar81._4_4_ = fVar69 * fVar68;
                fVar69 = auVar71._8_4_;
                auVar81._8_4_ = fVar70 * fVar69;
                fVar70 = auVar71._12_4_;
                auVar81._12_4_ = fVar95 * fVar70;
                auVar87._8_4_ = 0x3f800000;
                auVar87._0_8_ = &DAT_3f8000003f800000;
                auVar87._12_4_ = 0x3f800000;
                auVar71 = vsubps_avx(auVar87,auVar81);
                fVar60 = fVar60 + fVar60 * auVar71._0_4_;
                fVar68 = fVar68 + fVar68 * auVar71._4_4_;
                fVar69 = fVar69 + fVar69 * auVar71._8_4_;
                fVar70 = fVar70 + fVar70 * auVar71._12_4_;
                auVar94._0_4_ = fVar60 * local_2540._0_4_;
                auVar94._4_4_ = fVar68 * local_2540._4_4_;
                auVar94._8_4_ = fVar69 * local_2540._8_4_;
                auVar94._12_4_ = fVar70 * local_2540._12_4_;
                local_2630 = auVar92;
                local_24e0 = auVar94;
                local_2500[0] = fVar60 * local_2560._0_4_;
                local_2500[1] = fVar68 * local_2560._4_4_;
                local_2500[2] = fVar69 * local_2560._8_4_;
                local_2500[3] = fVar70 * local_2560._12_4_;
                local_24f0[0] = fVar60 * local_2560._16_4_;
                local_24f0[1] = fVar68 * local_2560._20_4_;
                local_24f0[2] = fVar69 * local_2560._24_4_;
                local_24f0[3] = fVar70 * local_2560._28_4_;
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar71 = vblendvps_avx(auVar65,auVar94,auVar92);
                auVar82 = vshufps_avx(auVar71,auVar71,0xb1);
                auVar82 = vminps_avx(auVar82,auVar71);
                auVar96 = vshufpd_avx(auVar82,auVar82,1);
                auVar82 = vminps_avx(auVar96,auVar82);
                auVar71 = vcmpps_avx(auVar71,auVar82,0);
                auVar82 = auVar92 & auVar71;
                if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar82[0xf] < '\0') {
                  auVar92 = vandps_avx(auVar71,auVar92);
                }
                uVar55 = vmovmskps_avx(auVar92);
                uVar56 = CONCAT44((int)((ulong)lVar43 >> 0x20),uVar55);
                piVar47 = (int *)0x0;
                local_2670 = auVar88;
                if (uVar56 != 0) {
                  for (; (uVar56 >> (long)piVar47 & 1) == 0; piVar47 = (int *)((long)piVar47 + 1)) {
                  }
                }
                do {
                  uVar108 = *(uint *)((long)&local_2490 + (long)piVar47 * 4);
                  pGVar9 = (pSVar51->geometries).items[uVar108].ptr;
                  if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2630 + (long)piVar47 * 4) = 0;
                    local_25e0 = auVar94;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar60 = local_2500[(long)piVar47];
                      fVar68 = local_24f0[(long)piVar47];
                      (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_24d0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_24c0 + (long)piVar47 * 4);
                      (ray->Ng).field_0.field_0.z =
                           *(float *)((long)&local_24b0 + (long)piVar47 * 4);
                      ray->u = fVar60;
                      ray->v = fVar68;
                      ray->primID = *(uint *)((long)&local_2570 + (long)piVar47 * 4);
                      ray->geomID = uVar108;
                      pRVar10 = context->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                      break;
                    }
                    local_2618 = context->args;
                    local_25e0 = auVar94;
                    local_2660._0_8_ = pSVar51;
                    local_2670._0_8_ = uVar52;
                    local_2650._0_8_ = pauVar54;
                    local_2640._0_8_ = context;
                    local_2610.context = context->user;
                    local_25b0 = *(float *)(local_24d0 + (long)piVar47 * 4);
                    local_25ac = *(undefined4 *)(local_24c0 + (long)piVar47 * 4);
                    local_25a8 = *(undefined4 *)((long)&local_24b0 + (long)piVar47 * 4);
                    local_25a4 = local_2500[(long)piVar47];
                    local_25a0 = local_24f0[(long)piVar47];
                    local_259c = *(undefined4 *)((long)&local_2570 + (long)piVar47 * 4);
                    local_2598 = uVar108;
                    local_2594 = (local_2610.context)->instID[0];
                    local_2590 = (local_2610.context)->instPrimID[0];
                    fVar60 = (ray->super_RayK<1>).tfar;
                    local_25c8 = piVar47;
                    (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)piVar47 * 4);
                    local_2674 = -1;
                    local_2610.valid = &local_2674;
                    local_2610.geometryUserPtr = pGVar9->userPtr;
                    local_2610.ray = (RTCRayN *)ray;
                    local_2610.hit = (RTCHitN *)&local_25b0;
                    local_2610.N = 1;
                    local_25d0 = pGVar9;
                    if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar9->intersectionFilterN)(&local_2610), *local_2610.valid != 0)) {
                      if (local_2618->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_2618->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_25d0->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_2618->filter)(&local_2610);
                        }
                        if (*local_2610.valid == 0) goto LAB_015aaf53;
                      }
                      (((Vec3f *)((long)local_2610.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2610.hit;
                      (((Vec3f *)((long)local_2610.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2610.hit + 4);
                      (((Vec3f *)((long)local_2610.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2610.hit + 8);
                      *(float *)((long)local_2610.ray + 0x3c) = *(float *)(local_2610.hit + 0xc);
                      *(float *)((long)local_2610.ray + 0x40) = *(float *)(local_2610.hit + 0x10);
                      *(float *)((long)local_2610.ray + 0x44) = *(float *)(local_2610.hit + 0x14);
                      *(float *)((long)local_2610.ray + 0x48) = *(float *)(local_2610.hit + 0x18);
                      *(float *)((long)local_2610.ray + 0x4c) = *(float *)(local_2610.hit + 0x1c);
                      *(float *)((long)local_2610.ray + 0x50) = *(float *)(local_2610.hit + 0x20);
                    }
                    else {
LAB_015aaf53:
                      (ray->super_RayK<1>).tfar = fVar60;
                    }
                    *(undefined4 *)(local_2630 + (long)local_25c8 * 4) = 0;
                    fVar60 = (ray->super_RayK<1>).tfar;
                    auVar66._4_4_ = fVar60;
                    auVar66._0_4_ = fVar60;
                    auVar66._8_4_ = fVar60;
                    auVar66._12_4_ = fVar60;
                    auVar92 = vcmpps_avx(local_25e0,auVar66,2);
                    local_2630 = vandps_avx(auVar92,local_2630);
                    pSVar51 = (Scene *)local_2660._0_8_;
                    uVar52 = local_2670._0_8_;
                    context = (RayQueryContext *)local_2640._0_8_;
                    pauVar54 = (undefined1 (*) [16])local_2650._0_8_;
                  }
                  if ((((local_2630 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2630 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2630 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2630[0xf]) break;
                  local_2640._0_8_ = context;
                  local_2650._0_8_ = pauVar54;
                  local_2670._0_8_ = uVar52;
                  local_2660._0_8_ = pSVar51;
                  BVHNIntersector1<8,1,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,true>>>
                  ::intersect(&local_2610);
                  piVar47 = local_2610.valid;
                  pSVar51 = (Scene *)local_2660._0_8_;
                  uVar52 = local_2670._0_8_;
                  context = (RayQueryContext *)local_2640._0_8_;
                  pauVar54 = (undefined1 (*) [16])local_2650._0_8_;
                  auVar94 = local_25e0;
                } while( true );
              }
            }
            lVar44 = lVar44 + 1;
          } while (lVar44 != uVar59 - 8);
        }
        fVar60 = (ray->super_RayK<1>).tfar;
        auVar67 = ZEXT3264(CONCAT428(fVar60,CONCAT424(fVar60,CONCAT420(fVar60,CONCAT416(fVar60,
                                                  CONCAT412(fVar60,CONCAT48(fVar60,CONCAT44(fVar60,
                                                  fVar60))))))));
        auVar99 = ZEXT3264(local_23c0);
        auVar101 = ZEXT3264(local_23e0);
        auVar104 = ZEXT3264(local_2400);
        auVar109 = ZEXT3264(local_2420);
        auVar113 = ZEXT3264(local_2440);
        auVar114 = ZEXT3264(local_2460);
        auVar115 = ZEXT3264(local_2480);
        uVar59 = local_25c0;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }